

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_graph.cpp
# Opt level: O0

Read<int> __thiscall
Omega_h::map_onto<int>(Omega_h *this,Read<int> *a_data,Graph *a2b,LO nb,int init_val,Int width)

{
  void *extraout_RDX;
  Read<int> RVar1;
  Write<int> local_c8;
  Write<int> local_b8;
  Graph local_a8;
  Read<int> local_88 [2];
  allocator local_61;
  string local_60 [32];
  undefined1 local_40 [8];
  Write<int> out;
  Int width_local;
  int init_val_local;
  LO nb_local;
  Graph *a2b_local;
  Read<int> *a_data_local;
  
  out.shared_alloc_.direct_ptr._4_4_ = width;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_60,"",&local_61);
  Write<int>::Write((Write<int> *)local_40,nb * width,init_val,(string *)local_60);
  std::__cxx11::string::~string(local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  Read<int>::Read(local_88,a_data);
  Graph::Graph(&local_a8,a2b);
  Write<int>::Write(&local_b8,(Write<int> *)local_40);
  map_into<int>(local_88,&local_a8,&local_b8,out.shared_alloc_.direct_ptr._4_4_);
  Write<int>::~Write(&local_b8);
  Graph::~Graph(&local_a8);
  Read<int>::~Read(local_88);
  Write<int>::Write(&local_c8,(Write<int> *)local_40);
  Read<int>::Read((Read<int> *)this,&local_c8);
  Write<int>::~Write(&local_c8);
  Write<int>::~Write((Write<int> *)local_40);
  RVar1.write_.shared_alloc_.direct_ptr = extraout_RDX;
  RVar1.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Read<int>)RVar1.write_.shared_alloc_;
}

Assistant:

Read<T> map_onto(Read<T> a_data, Graph a2b, LO nb, T init_val, Int width) {
  auto out = Write<T>(nb * width, init_val);
  map_into(a_data, a2b, out, width);
  return out;
}